

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int copyEntityTable(XML_Parser oldParser,HASH_TABLE *newTable,STRING_POOL *newPool,
                   HASH_TABLE *oldTable)

{
  XML_Char XVar1;
  bool bVar2;
  XML_Bool XVar3;
  XML_Char *pXVar4;
  NAMED *pNVar5;
  KEY pXVar6;
  XML_Char *pXVar7;
  NAMED **ppNVar8;
  NAMED *pNVar9;
  NAMED **ppNVar10;
  int iVar11;
  XML_Char *local_58;
  KEY local_50;
  
  ppNVar8 = oldTable->v;
  if (ppNVar8 == (NAMED **)0x0) {
    ppNVar10 = (NAMED **)0x0;
  }
  else {
    ppNVar10 = ppNVar8 + oldTable->size;
  }
  local_50 = (KEY)0x0;
  pXVar7 = (XML_Char *)0x0;
LAB_001793cc:
  do {
    if (ppNVar8 == ppNVar10) {
      pNVar9 = (NAMED *)0x0;
    }
    else {
      pNVar9 = *ppNVar8;
      ppNVar8 = ppNVar8 + 1;
      if (pNVar9 == (NAMED *)0x0) goto LAB_001793cc;
    }
    local_58 = pXVar7;
    if (pNVar9 == (NAMED *)0x0) {
      iVar11 = 2;
    }
    else {
      pXVar4 = poolCopyString(newPool,pNVar9->name);
      iVar11 = 1;
      if ((pXVar4 != (XML_Char *)0x0) &&
         (pNVar5 = lookup(oldParser,newTable,pXVar4,0x40), pNVar5 != (NAMED *)0x0)) {
        if (pNVar9[3].name == (XML_Char *)0x0) {
          pXVar6 = pNVar9[1].name;
          iVar11 = *(int *)&pNVar9[2].name;
          if ((newPool->ptr == (XML_Char *)0x0) && (XVar3 = poolGrow(newPool), XVar3 == '\0')) {
LAB_0017956a:
            pXVar6 = (KEY)0x0;
          }
          else {
            if (0 < iVar11) {
              iVar11 = iVar11 + 1;
              do {
                if ((newPool->ptr == newPool->end) && (XVar3 = poolGrow(newPool), XVar3 == '\0'))
                goto LAB_0017956a;
                XVar1 = *pXVar6;
                pXVar4 = newPool->ptr;
                newPool->ptr = pXVar4 + 1;
                *pXVar4 = XVar1;
                pXVar6 = pXVar6 + 1;
                iVar11 = iVar11 + -1;
              } while (1 < iVar11);
            }
            pXVar6 = newPool->start;
            newPool->start = newPool->ptr;
          }
          iVar11 = 1;
          if (pXVar6 == (KEY)0x0) goto LAB_001795da;
          pNVar5[1].name = pXVar6;
          *(undefined4 *)&pNVar5[2].name = *(undefined4 *)&pNVar9[2].name;
        }
        else {
          pXVar4 = poolCopyString(newPool,pNVar9[3].name);
          if (pXVar4 == (XML_Char *)0x0) {
LAB_00179557:
            bVar2 = false;
          }
          else {
            pNVar5[3].name = pXVar4;
            local_58 = pNVar9[4].name;
            if (local_58 == (XML_Char *)0x0) {
LAB_00179528:
              local_58 = pXVar7;
              bVar2 = true;
              if (pNVar9[5].name != (XML_Char *)0x0) {
                pXVar7 = poolCopyString(newPool,pNVar9[5].name);
                if (pXVar7 == (XML_Char *)0x0) goto LAB_00179557;
                pNVar5[5].name = pXVar7;
                bVar2 = true;
              }
            }
            else {
              pXVar6 = local_50;
              if ((local_58 == pXVar7) ||
                 (pXVar6 = poolCopyString(newPool,local_58), pXVar7 = local_58,
                 pXVar6 != (XML_Char *)0x0)) {
                pNVar5[4].name = pXVar6;
                local_50 = pXVar6;
                goto LAB_00179528;
              }
              bVar2 = false;
            }
          }
          iVar11 = 1;
          pXVar7 = local_58;
          if (!bVar2) goto LAB_001795da;
        }
        local_58 = pXVar7;
        if (pNVar9[6].name != (XML_Char *)0x0) {
          pXVar7 = poolCopyString(newPool,pNVar9[6].name);
          if (pXVar7 == (XML_Char *)0x0) {
            iVar11 = 1;
            goto LAB_001795da;
          }
          pNVar5[6].name = pXVar7;
        }
        *(undefined1 *)((long)&pNVar5[7].name + 1) = *(undefined1 *)((long)&pNVar9[7].name + 1);
        *(undefined1 *)((long)&pNVar5[7].name + 2) = *(undefined1 *)((long)&pNVar9[7].name + 2);
        iVar11 = 0;
      }
    }
LAB_001795da:
    pXVar7 = local_58;
    if (iVar11 != 0) {
      return (uint)(iVar11 == 2);
    }
  } while( true );
}

Assistant:

static int
copyEntityTable(XML_Parser oldParser, HASH_TABLE *newTable,
                STRING_POOL *newPool, const HASH_TABLE *oldTable) {
  HASH_TABLE_ITER iter;
  const XML_Char *cachedOldBase = NULL;
  const XML_Char *cachedNewBase = NULL;

  hashTableIterInit(&iter, oldTable);

  for (;;) {
    ENTITY *newE;
    const XML_Char *name;
    const ENTITY *oldE = (ENTITY *)hashTableIterNext(&iter);
    if (! oldE)
      break;
    name = poolCopyString(newPool, oldE->name);
    if (! name)
      return 0;
    newE = (ENTITY *)lookup(oldParser, newTable, name, sizeof(ENTITY));
    if (! newE)
      return 0;
    if (oldE->systemId) {
      const XML_Char *tem = poolCopyString(newPool, oldE->systemId);
      if (! tem)
        return 0;
      newE->systemId = tem;
      if (oldE->base) {
        if (oldE->base == cachedOldBase)
          newE->base = cachedNewBase;
        else {
          cachedOldBase = oldE->base;
          tem = poolCopyString(newPool, cachedOldBase);
          if (! tem)
            return 0;
          cachedNewBase = newE->base = tem;
        }
      }
      if (oldE->publicId) {
        tem = poolCopyString(newPool, oldE->publicId);
        if (! tem)
          return 0;
        newE->publicId = tem;
      }
    } else {
      const XML_Char *tem
          = poolCopyStringN(newPool, oldE->textPtr, oldE->textLen);
      if (! tem)
        return 0;
      newE->textPtr = tem;
      newE->textLen = oldE->textLen;
    }
    if (oldE->notation) {
      const XML_Char *tem = poolCopyString(newPool, oldE->notation);
      if (! tem)
        return 0;
      newE->notation = tem;
    }
    newE->is_param = oldE->is_param;
    newE->is_internal = oldE->is_internal;
  }
  return 1;
}